

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_tet_quality(REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  REF_DBL *pRVar5;
  uint uVar6;
  long lVar7;
  undefined8 uVar8;
  char *pcVar9;
  ulong uVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  REF_DBL RVar15;
  undefined1 auVar16 [16];
  double dVar17;
  REF_DBL det;
  double dStack_380;
  double local_378;
  double local_368;
  undefined8 uStack_360;
  double local_358;
  undefined8 uStack_350;
  double local_348;
  undefined8 uStack_340;
  REF_DBL volume;
  double local_330;
  double local_328;
  double local_318;
  double local_310;
  double local_308;
  double local_300;
  double local_2f8;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  double local_2d8;
  double local_2d0;
  double local_2c8;
  double local_2c0;
  double local_2b8;
  REF_DBL det_1;
  REF_DBL e5 [3];
  REF_DBL e4 [3];
  REF_DBL e3 [3];
  REF_DBL e2 [3];
  REF_DBL l5;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  REF_DBL l4;
  REF_DBL l3;
  REF_DBL l2;
  REF_DBL l1;
  REF_DBL l0;
  REF_DBL jac [9];
  
  if (ref_node->tet_quality == 2) {
    uVar6 = ref_node_tet_vol(ref_node,nodes,&local_2b8);
    if (uVar6 == 0) {
      if (local_2b8 <= ref_node->min_volume) {
        RVar15 = local_2b8 - ref_node->min_volume;
LAB_001771ec:
        *quality = RVar15;
        return 0;
      }
      local_368 = local_2b8;
      uStack_360 = 0;
      ref_node_metric_get_log(ref_node,*nodes,&l0);
      ref_node_metric_get_log(ref_node,nodes[1],&l1);
      ref_node_metric_get_log(ref_node,nodes[2],&l2);
      ref_node_metric_get_log(ref_node,nodes[3],&l3);
      for (lVar7 = 0; lVar7 != 6; lVar7 = lVar7 + 1) {
        (&l4)[lVar7] = ((&l0)[lVar7] + (&l1)[lVar7] + (&l2)[lVar7] + (&l3)[lVar7]) * 0.25;
      }
      uVar6 = ref_matrix_exp_m(&l4,&l5);
      if (uVar6 == 0) {
        uVar6 = ref_matrix_jacob_m(&l5,jac);
        if (uVar6 == 0) {
          iVar1 = nodes[1];
          pRVar5 = ref_node->real;
          iVar2 = *nodes;
          for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
            (&det)[lVar7] = pRVar5[iVar1 * 0xf + lVar7] - pRVar5[iVar2 * 0xf + lVar7];
          }
          iVar3 = nodes[2];
          for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
            (&volume)[lVar7] = pRVar5[iVar3 * 0xf + lVar7] - pRVar5[iVar2 * 0xf + lVar7];
          }
          iVar4 = nodes[3];
          for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
            e2[lVar7] = pRVar5[iVar4 * 0xf + lVar7] - pRVar5[iVar2 * 0xf + lVar7];
          }
          for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
            e3[lVar7] = pRVar5[iVar3 * 0xf + lVar7] - pRVar5[iVar1 * 0xf + lVar7];
          }
          for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
            e4[lVar7] = pRVar5[iVar4 * 0xf + lVar7] - pRVar5[iVar1 * 0xf + lVar7];
          }
          for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
            e5[lVar7] = pRVar5[iVar4 * 0xf + lVar7] - pRVar5[iVar3 * 0xf + lVar7];
          }
          local_348 = local_188;
          uStack_340 = 0;
          local_358 = local_178;
          uStack_350 = 0;
          local_310 = e2[0];
          local_318 = e2[1];
          local_308 = e2[2];
          local_2f8 = e3[0];
          local_300 = e3[1];
          local_2f0 = e3[2];
          local_2e0 = e4[0];
          local_2e8 = e4[1];
          local_2d8 = e4[2];
          local_2c8 = e5[0];
          local_2d0 = e5[1];
          local_2c0 = e5[2];
          uVar6 = ref_matrix_det_m(&l5,&det_1);
          if (uVar6 == 0) {
            dVar17 = (local_170 * local_2c0 + local_348 * local_2c8 + local_358 * local_2d0) *
                     local_2c0 +
                     (local_348 * local_2c0 + l5 * local_2c8 + local_190 * local_2d0) * local_2c8 +
                     (local_358 * local_2c0 + local_190 * local_2c8 + local_180 * local_2d0) *
                     local_2d0 +
                     (local_170 * local_2d8 + local_348 * local_2e0 + local_358 * local_2e8) *
                     local_2d8 +
                     (local_348 * local_2d8 + l5 * local_2e0 + local_190 * local_2e8) * local_2e0 +
                     (local_358 * local_2d8 + local_190 * local_2e0 + local_180 * local_2e8) *
                     local_2e8 +
                     (local_170 * local_2f0 + local_348 * local_2f8 + local_358 * local_300) *
                     local_2f0 +
                     (local_348 * local_2f0 + l5 * local_2f8 + local_190 * local_300) * local_2f8 +
                     (local_358 * local_2f0 + local_190 * local_2f8 + local_180 * local_300) *
                     local_300 +
                     (local_170 * local_308 + local_348 * local_310 + local_358 * local_318) *
                     local_308 +
                     (local_348 * local_308 + l5 * local_310 + local_190 * local_318) * local_310 +
                     (local_358 * local_308 + local_190 * local_310 + local_180 * local_318) *
                     local_318 +
                     (local_170 * local_328 + local_348 * volume + local_358 * local_330) *
                     local_328 +
                     (local_348 * local_328 + l5 * volume + local_190 * local_330) * volume +
                     (local_358 * local_328 + local_190 * volume + local_180 * local_330) *
                     local_330 +
                     (local_170 * local_378 + local_348 * det + local_358 * dStack_380) * local_378
                     + (local_348 * local_378 + l5 * det + local_190 * dStack_380) * det +
                       (local_358 * local_378 + local_190 * det + local_180 * dStack_380) *
                       dStack_380;
            if (det_1 < 0.0) {
              dVar11 = sqrt(det_1);
            }
            else {
              dVar11 = SQRT(det_1);
            }
            dVar11 = pow(local_368 * dVar11,0.6666666666666666);
            auVar12._0_8_ = dVar17 * 1e+20;
            auVar12._8_8_ = dVar11;
            auVar13._0_8_ = -auVar12._0_8_;
            auVar13._8_8_ = -dVar11;
            auVar14 = maxpd(auVar12,auVar13);
            uVar10 = -(ulong)(auVar14._8_8_ < auVar14._0_8_);
            RVar15 = (REF_DBL)(~uVar10 & 0xbff0000000000000 |
                              (ulong)((dVar11 * 24.9610058766228) / dVar17) & uVar10);
            goto LAB_001771ec;
          }
          uVar10 = (ulong)uVar6;
          pcVar9 = "det(mavg)";
          uVar8 = 0x78d;
        }
        else {
          uVar10 = (ulong)uVar6;
          pcVar9 = "jac";
          uVar8 = 0x774;
        }
      }
      else {
        uVar10 = (ulong)uVar6;
        pcVar9 = "exp";
        uVar8 = 0x773;
      }
    }
    else {
      uVar10 = (ulong)uVar6;
      pcVar9 = "vol";
      uVar8 = 0x767;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar8,
           "ref_node_tet_jac_quality",uVar10,pcVar9);
    pcVar9 = "jac";
    uVar8 = 0x7a4;
  }
  else {
    if (ref_node->tet_quality != 1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x7a7,
             "ref_node_tet_quality","case not recognized");
      return 1;
    }
    uVar6 = ref_node_tet_vol(ref_node,nodes,&volume);
    if (uVar6 == 0) {
      if (volume <= ref_node->min_volume) {
        RVar15 = volume - ref_node->min_volume;
LAB_001771e2:
        *quality = RVar15;
        return 0;
      }
      local_368 = volume;
      uStack_360 = 0;
      uVar6 = ref_node_ratio(ref_node,*nodes,nodes[1],&l0);
      if (uVar6 == 0) {
        uVar6 = ref_node_ratio(ref_node,*nodes,nodes[2],&l1);
        if (uVar6 == 0) {
          uVar6 = ref_node_ratio(ref_node,*nodes,nodes[3],&l2);
          if (uVar6 == 0) {
            uVar6 = ref_node_ratio(ref_node,nodes[1],nodes[2],&l3);
            if (uVar6 == 0) {
              uVar6 = ref_node_ratio(ref_node,nodes[1],nodes[3],&l4);
              if (uVar6 == 0) {
                uVar6 = ref_node_ratio(ref_node,nodes[2],nodes[3],&l5);
                if (uVar6 == 0) {
                  ref_node_metric_get(ref_node,*nodes,jac);
                  uVar6 = ref_matrix_det_m(jac,&det);
                  dVar17 = det;
                  if (uVar6 == 0) {
                    ref_node_metric_get(ref_node,nodes[1],jac);
                    uVar6 = ref_matrix_det_m(jac,&det);
                    if (uVar6 == 0) {
                      local_348 = det;
                      ref_node_metric_get(ref_node,nodes[2],jac);
                      uVar6 = ref_matrix_det_m(jac,&det);
                      if (uVar6 == 0) {
                        local_358 = det;
                        ref_node_metric_get(ref_node,nodes[3],jac);
                        uVar6 = ref_matrix_det_m(jac,&det);
                        if (uVar6 == 0) {
                          if (local_348 <= dVar17) {
                            dVar17 = local_348;
                          }
                          if (local_358 <= dVar17) {
                            dVar17 = local_358;
                          }
                          if (det <= dVar17) {
                            dVar17 = det;
                          }
                          if (dVar17 < 0.0) {
                            dVar17 = sqrt(dVar17);
                          }
                          else {
                            dVar17 = SQRT(dVar17);
                          }
                          dVar17 = pow(local_368 * dVar17,0.6666666666666666);
                          dVar11 = l5 * l5 + l4 * l4 + l3 * l3 + l2 * l2 + l0 * l0 + l1 * l1;
                          auVar14._0_8_ = dVar11 * 1e+20;
                          auVar14._8_8_ = dVar17;
                          auVar16._0_8_ = -auVar14._0_8_;
                          auVar16._8_8_ = -dVar17;
                          auVar14 = maxpd(auVar14,auVar16);
                          uVar10 = -(ulong)(auVar14._8_8_ < auVar14._0_8_);
                          RVar15 = (REF_DBL)(~uVar10 & 0xbff0000000000000 |
                                            (ulong)((dVar17 * 24.9610058766228) / dVar11) & uVar10);
                          goto LAB_001771e2;
                        }
                        uVar10 = (ulong)uVar6;
                        pcVar9 = "n3";
                        uVar8 = 0x693;
                      }
                      else {
                        uVar10 = (ulong)uVar6;
                        pcVar9 = "n2";
                        uVar8 = 0x68f;
                      }
                    }
                    else {
                      uVar10 = (ulong)uVar6;
                      pcVar9 = "n1";
                      uVar8 = 0x68b;
                    }
                  }
                  else {
                    uVar10 = (ulong)uVar6;
                    pcVar9 = "n0";
                    uVar8 = 0x687;
                  }
                }
                else {
                  uVar10 = (ulong)uVar6;
                  pcVar9 = "l5";
                  uVar8 = 0x684;
                }
              }
              else {
                uVar10 = (ulong)uVar6;
                pcVar9 = "l4";
                uVar8 = 0x683;
              }
            }
            else {
              uVar10 = (ulong)uVar6;
              pcVar9 = "l3";
              uVar8 = 0x682;
            }
          }
          else {
            uVar10 = (ulong)uVar6;
            pcVar9 = "l2";
            uVar8 = 0x681;
          }
        }
        else {
          uVar10 = (ulong)uVar6;
          pcVar9 = "l1";
          uVar8 = 0x680;
        }
      }
      else {
        uVar10 = (ulong)uVar6;
        pcVar9 = "l0";
        uVar8 = 0x67f;
      }
    }
    else {
      uVar10 = (ulong)uVar6;
      pcVar9 = "vol";
      uVar8 = 0x678;
    }
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar8,
           "ref_node_tet_epic_quality",uVar10,pcVar9);
    pcVar9 = "epic";
    uVar8 = 0x7a1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar8,
         "ref_node_tet_quality",uVar10,pcVar9);
  return (REF_STATUS)uVar10;
}

Assistant:

REF_FCN REF_STATUS ref_node_tet_quality(REF_NODE ref_node, REF_INT *nodes,
                                        REF_DBL *quality) {
  switch (ref_node->tet_quality) {
    case REF_NODE_EPIC_QUALITY:
      RSS(ref_node_tet_epic_quality(ref_node, nodes, quality), "epic");
      break;
    case REF_NODE_JAC_QUALITY:
      RSS(ref_node_tet_jac_quality(ref_node, nodes, quality), "jac");
      break;
    default:
      THROW("case not recognized");
  }
  return REF_SUCCESS;
}